

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void __thiscall
andres::View<int,_true,_std::allocator<unsigned_long>_>::transpose
          (View<int,_true,_std::allocator<unsigned_long>_> *this,size_t c1,size_t c2)

{
  size_t sVar1;
  size_t sVar2;
  size_t *psVar3;
  size_t *end;
  size_t *strideBegin;
  CoordinateOrder *coordinateOrder;
  bool local_41;
  size_t d;
  size_t c;
  size_t j2;
  size_t j1;
  size_t c2_local;
  size_t c1_local;
  View<int,_true,_std::allocator<unsigned_long>_> *this_local;
  
  testInvariant(this);
  sVar2 = dimension(this);
  local_41 = false;
  if (sVar2 != 0) {
    sVar2 = dimension(this);
    local_41 = false;
    if (c1 < sVar2) {
      sVar2 = dimension(this);
      local_41 = c2 < sVar2;
    }
  }
  marray_detail::Assert<bool>(local_41);
  psVar3 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shape(&this->geometry_,c2);
  sVar2 = *psVar3;
  psVar3 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shape(&this->geometry_,c1);
  sVar1 = *psVar3;
  psVar3 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shape(&this->geometry_,c2);
  *psVar3 = sVar1;
  psVar3 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shape(&this->geometry_,c1);
  *psVar3 = sVar2;
  psVar3 = marray_detail::Geometry<std::allocator<unsigned_long>_>::strides(&this->geometry_,c2);
  sVar2 = *psVar3;
  psVar3 = marray_detail::Geometry<std::allocator<unsigned_long>_>::strides(&this->geometry_,c1);
  sVar1 = *psVar3;
  psVar3 = marray_detail::Geometry<std::allocator<unsigned_long>_>::strides(&this->geometry_,c2);
  *psVar3 = sVar1;
  psVar3 = marray_detail::Geometry<std::allocator<unsigned_long>_>::strides(&this->geometry_,c1);
  *psVar3 = sVar2;
  psVar3 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeBegin(&this->geometry_);
  end = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeEnd(&this->geometry_);
  strideBegin = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeStridesBegin
                          (&this->geometry_);
  coordinateOrder =
       marray_detail::Geometry<std::allocator<unsigned_long>_>::coordinateOrder(&this->geometry_);
  marray_detail::stridesFromShape<unsigned_long*,unsigned_long*>
            (psVar3,end,strideBegin,coordinateOrder);
  updateSimplicity(this);
  testInvariant(this);
  return;
}

Assistant:

void
View<T, isConst, A>::transpose
(
    const std::size_t c1,
    const std::size_t c2
)
{
    testInvariant();
    marray_detail::Assert(MARRAY_NO_ARG_TEST ||
        (dimension() != 0 && c1 < dimension() && c2 < dimension()));

    std::size_t j1 = c1;
    std::size_t j2 = c2;
    std::size_t c;
    std::size_t d;

    // transpose shape
    c = geometry_.shape(j2);
    geometry_.shape(j2) = geometry_.shape(j1);
    geometry_.shape(j1) = c;

    // transpose strides
    d = geometry_.strides(j2);
    geometry_.strides(j2) = geometry_.strides(j1);
    geometry_.strides(j1) = d;

    // update shape strides
    marray_detail::stridesFromShape(geometry_.shapeBegin(), geometry_.shapeEnd(),
        geometry_.shapeStridesBegin(), geometry_.coordinateOrder());

    updateSimplicity();
    testInvariant();
}